

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Color.cpp
# Opt level: O3

string * Color::colorize(string *__return_storage_ptr__,string *input,string *spec)

{
  Color c;
  Color local_1c;
  
  Color(&local_1c,spec);
  colorize(__return_storage_ptr__,&local_1c,input);
  return __return_storage_ptr__;
}

Assistant:

std::string Color::colorize (const std::string& input, const std::string& spec)
{
#ifdef FEATURE_COLOR
  Color c (spec);
  return c.colorize (input);
#else
  return input;
#endif
}